

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Token * __thiscall Lexer::next_token(Token *__return_storage_ptr__,Lexer *this)

{
  char *c;
  byte bVar1;
  bool bVar2;
  lexer_exception *plVar3;
  ostream *poVar4;
  byte bVar5;
  Type local_1d4;
  string local_1d0;
  Token t;
  
  c = &this->current_;
  while( true ) {
    while( true ) {
      while( true ) {
        bVar1 = this->npos;
        bVar5 = this->current_;
        if (bVar5 == bVar1) {
          local_1d0._M_dataplus._M_p = local_1d0._M_dataplus._M_p & 0xffffffff00000000;
          t.content_._M_dataplus._M_p = *(pointer *)&(this->position_).super_Position.row_;
          t._0_8_ = &PTR_clear_001599f0;
          t.content_._M_string_length._0_4_ = 0;
          Token::Token(__return_storage_ptr__,(Type *)&local_1d0,(TokenPosition *)&t);
          return __return_storage_ptr__;
        }
        if (this->in_row_comment_ != true) break;
        while ((bVar5 != 10 && (bVar5 != bVar1))) {
          t._0_8_ = t._0_8_ & 0xffffffffffffff00;
          consume(this,(bool *)&t);
          bVar1 = this->npos;
          bVar5 = this->current_;
        }
        this->in_row_comment_ = false;
      }
      if (this->in_block_comment_ != true) break;
      while (bVar5 != bVar1) {
        while ((bVar5 != 0x2a && (bVar5 != bVar1))) {
          t._0_8_ = t._0_8_ & 0xffffffffffffff00;
          consume(this,(bool *)&t);
          bVar1 = this->npos;
          bVar5 = this->current_;
        }
        if (bVar5 == bVar1) {
          plVar3 = (lexer_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string((string *)&t,anon_var_dwarf_3aad5,(allocator *)&local_1d0);
          lexer_exception::lexer_exception(plVar3,&this->position_,(string *)&t);
          __cxa_throw(plVar3,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
        }
        match_times(&t,this);
        if (t.type_ == kRightBlockComment) {
          this->in_block_comment_ = false;
          local_1d4 = kRightBlockComment;
          local_1d0._M_string_length._0_4_ = (this->position_).super_Position.row_;
          local_1d0._M_string_length._4_4_ = (this->position_).super_Position.col_;
          local_1d0._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
          local_1d0.field_2._M_allocated_capacity._0_4_ = 2;
          Token::Token(__return_storage_ptr__,&local_1d4,(TokenPosition *)&local_1d0);
          Token::~Token(&t);
          return __return_storage_ptr__;
        }
        Token::~Token(&t);
        bVar1 = this->npos;
        bVar5 = this->current_;
      }
    }
    if (((1 < bVar5 - 9) && (bVar5 != 0xd)) && (bVar5 != 0x20)) break;
    skip_whitespace(this);
  }
  switch(bVar5) {
  case 0x28:
    match_left_paren(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x29:
    match_right_paren(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x2a:
    match_times(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x2b:
    match_plus(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x2c:
    match_comma(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x2d:
    match_minus(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
    goto switchD_0012ce66_caseD_2e;
  case 0x2f:
    match_divide(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x3b:
    match_semicolon(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x3c:
    match_lt(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x3d:
    match_equal(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x3e:
    match_gt(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  default:
    if (bVar5 == 0x5b) {
      match_left_bracket(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (bVar5 == 0x5d) {
      match_right_bracket(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (bVar5 == 0x7b) {
      match_left_brace(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if (bVar5 == 0x7d) {
      match_right_brace(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
switchD_0012ce66_caseD_2e:
    bVar2 = Recognition::is_letter(c);
    if (bVar2) {
      match_name(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if ((byte)(*c - 0x30U) < 10) {
      match_digit(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&t);
    poVar4 = std::operator<<((ostream *)&t.content_._M_string_length,anon_var_dwarf_3aaee);
    std::operator<<(poVar4,*c);
    plVar3 = (lexer_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    lexer_exception::lexer_exception(plVar3,&this->position_,&local_1d0);
    __cxa_throw(plVar3,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
  }
}

Assistant:

Token Lexer::next_token() {
    while (current_ != npos) {
        if (in_row_comment_) {  // 在行注释中
            while (current_ != npos && !Recognition::is_newline(current_)) {
                consume(false);
            }
            in_row_comment_ = false;
            continue;
        }
        if (in_block_comment_) {  // 在块注释中
            while (current_ != npos) {
                while (current_ != npos && current_ != '*') {
                    consume(false);
                }
                if (current_ == npos) {
                    throw lexer_exception(position_, "未闭合的注释块");
                } else {
                    Token t = match_times();
                    if (t.type() == Token::Type::kRightBlockComment) {
                        in_block_comment_ = false;
                        return Token(Token::Type::kRightBlockComment, TokenPosition(position_, 2));
                    }
                }
            }
            continue;  // 保证 EOF 会被正确处理
        }

        switch (current_) {
            case ' ':
            case '\t':
            case '\n':
            case '\r':
                skip_whitespace();
                continue;
            case '(': return match_left_paren();
            case ')': return match_right_paren();
            case '[': return match_left_bracket();
            case ']': return match_right_bracket();
            case '{': return match_left_brace();
            case '}': return match_right_brace();
            case ';': return match_semicolon();
            case ',': return match_comma();
            case '=': return match_equal();
            case '+': return match_plus();
            case '-': return match_minus();
            case '*': return match_times();
            case '/': return match_divide();
            case '<': return match_lt();
            case '>': return match_gt();
            default:
                if (Recognition::is_letter(current_)) {
                    return match_name();
                } else if (Recognition::is_digit(current_)) {
                    return match_digit();
                } else {
                    std::stringstream buffer;
                    buffer << "不合法的字符: " << current_;
                    throw lexer_exception(position_, buffer.str());
                }
        }
    }
    return Token(Token::Type::kEOF, TokenPosition(position_, 0));
}